

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  BVH *bvh;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  bool bVar41;
  uint uVar42;
  undefined4 uVar43;
  int iVar44;
  AABBNodeMB4D *node1;
  ulong uVar45;
  RTCIntersectArguments *pRVar46;
  RTCIntersectArguments *pRVar47;
  RTCIntersectArguments *pRVar48;
  long lVar49;
  RTCIntersectArguments *pRVar50;
  RTCIntersectArguments *pRVar51;
  uint uVar52;
  long lVar53;
  QuadMesh *mesh;
  size_t sVar54;
  ulong uVar55;
  vuint<4> *v;
  long lVar56;
  NodeRef *pNVar57;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar58;
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 in_ZMM0 [64];
  float fVar69;
  float fVar70;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar95;
  undefined1 auVar91 [64];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar124;
  float fVar125;
  vint4 ai_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar126;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  float fVar149;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar153;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar175;
  float fVar177;
  float fVar179;
  vint4 bi_3;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar180;
  undefined1 auVar165 [16];
  float fVar176;
  float fVar178;
  float fVar181;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar182;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  vint4 bi;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  vint4 bi_2;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar205;
  float fVar210;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar211;
  float fVar216;
  float fVar217;
  undefined1 auVar212 [16];
  float fVar218;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar219;
  float fVar227;
  float fVar228;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar231;
  undefined1 auVar224 [16];
  float fVar229;
  float fVar232;
  undefined1 auVar225 [16];
  float fVar230;
  float fVar233;
  undefined1 auVar226 [16];
  float fVar234;
  float fVar241;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar243;
  float fVar248;
  float fVar249;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar250;
  float fVar251;
  float fVar255;
  float fVar256;
  vint4 ai;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar257;
  undefined1 auVar254 [16];
  float fVar258;
  float fVar260;
  float fVar261;
  vint4 ai_1;
  undefined1 auVar259 [16];
  float fVar262;
  vint4 ai_3;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar266 [16];
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  undefined1 local_1b08 [8];
  float fStack_1b00;
  float fStack_1afc;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1ac8;
  float fStack_1ac4;
  float fStack_1ac0;
  Precalculations pre;
  undefined1 local_1a98 [8];
  float fStack_1a90;
  float fStack_1a8c;
  undefined1 local_1a78 [16];
  RTCIntersectArguments *local_1a60;
  RTCIntersectArguments *local_1a58;
  uint local_1a4c;
  undefined1 local_1a48 [16];
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1998 [16];
  float local_1978;
  float fStack_1974;
  float fStack_1970;
  float fStack_196c;
  undefined1 local_1958 [8];
  float fStack_1950;
  float fStack_194c;
  undefined1 local_1948 [8];
  float fStack_1940;
  float fStack_193c;
  undefined1 local_1938 [8];
  float fStack_1930;
  float fStack_192c;
  float local_18f8;
  float fStack_18f4;
  float fStack_18f0;
  vint<4> itime;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 uStack_1880;
  vfloat<4> t;
  vfloat<4> v_1;
  vfloat<4> u;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar23 = mm_lookupmask_ps._248_8_;
  uVar22 = mm_lookupmask_ps._240_8_;
  uVar21 = mm_lookupmask_ps._8_8_;
  uVar20 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar66 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar66,(undefined1  [16])valid_i->field_0);
    auVar139 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar139,5);
    auVar89 = auVar72 & auVar9;
    if ((((auVar89 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar89 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar89 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar89[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar72);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar212._8_4_ = 0x7fffffff;
      auVar212._0_8_ = 0x7fffffff7fffffff;
      auVar212._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar212,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar220._8_4_ = 0x219392ef;
      auVar220._0_8_ = 0x219392ef219392ef;
      auVar220._12_4_ = 0x219392ef;
      auVar89 = vcmpps_avx(auVar72,auVar220,1);
      auVar244._8_4_ = 0x3f800000;
      auVar244._0_8_ = 0x3f8000003f800000;
      auVar244._12_4_ = 0x3f800000;
      auVar183 = vdivps_avx(auVar244,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar72 = vandps_avx(auVar212,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar159 = vcmpps_avx(auVar72,auVar220,1);
      auVar197 = vdivps_avx(auVar244,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vandps_avx(auVar212,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar220,1);
      auVar140 = vdivps_avx(auVar244,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar221._8_4_ = 0x5d5e0b6b;
      auVar221._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar221._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar183,auVar221,auVar89)
      ;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar197,auVar221,auVar159);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar140,auVar221,auVar72)
      ;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar139,1);
      auVar197._8_4_ = 0x10;
      auVar197._0_8_ = 0x1000000010;
      auVar197._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar197);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar139,5);
      auVar89._8_4_ = 0x20;
      auVar89._0_8_ = 0x2000000020;
      auVar89._12_4_ = 0x20;
      auVar140._8_4_ = 0x30;
      auVar140._0_8_ = 0x3000000030;
      auVar140._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar140,auVar89,auVar72)
      ;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar139,5);
      auVar159._8_4_ = 0x40;
      auVar159._0_8_ = 0x4000000040;
      auVar159._12_4_ = 0x40;
      auVar183._8_4_ = 0x50;
      auVar183._0_8_ = 0x5000000050;
      auVar183._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar183,auVar159,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar139);
      auVar89 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar139);
      auVar139._8_4_ = 0x7f800000;
      auVar139._0_8_ = 0x7f8000007f800000;
      auVar139._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar139,auVar72,auVar9);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar89,auVar9);
      terminated.field_0.i[1] = auVar9._4_4_ ^ auVar66._4_4_;
      terminated.field_0.i[0] = auVar9._0_4_ ^ auVar66._0_4_;
      terminated.field_0.i[2] = auVar9._8_4_ ^ auVar66._8_4_;
      terminated.field_0.i[3] = auVar9._12_4_ ^ auVar66._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar52 = 3;
      }
      else {
        uVar52 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1a60 = (RTCIntersectArguments *)(ray + 0x80);
      pNVar57 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar58 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00ec4fcd:
      do {
        do {
          root.ptr = pNVar57[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec6a06;
          pNVar57 = pNVar57 + -1;
          paVar58 = paVar58 + -1;
          aVar71 = *paVar58;
          auVar66 = vcmpps_avx((undefined1  [16])aVar71,(undefined1  [16])tray.tfar.field_0,1);
          uVar42 = vmovmskps_avx(auVar66);
        } while (uVar42 == 0);
        uVar45 = (ulong)(uVar42 & 0xff);
        uVar42 = POPCOUNT(uVar42 & 0xff);
        if (uVar52 < uVar42) {
LAB_00ec5010:
          auVar91 = ZEXT1664((undefined1  [16])aVar71);
          do {
            uVar42 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ec6a06;
              auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar91._0_16_,6);
              if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar66[0xf]) goto LAB_00ec4fcd;
              pRVar46 = (RTCIntersectArguments *)((ulong)(uVar42 & 0xf) - 8);
              auVar66 = vpcmpeqd_avx(auVar66,auVar66);
              pRVar51 = (RTCIntersectArguments *)0x0;
              pRVar48 = pRVar46;
              local_1998 = auVar66 ^ (undefined1  [16])terminated.field_0;
              goto LAB_00ec52e9;
            }
            uVar45 = root.ptr & 0xfffffffffffffff0;
            auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar91._0_16_,6);
            auVar91 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            root.ptr = 8;
            for (lVar53 = -0x10;
                (aVar71 = auVar91._0_16_, lVar53 != 0 &&
                (sVar54 = *(size_t *)(uVar45 + 0x20 + lVar53 * 2), sVar54 != 8));
                lVar53 = lVar53 + 4) {
              fVar59 = *(float *)(uVar45 + 0x90 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x30 + lVar53);
              auVar72 = *(undefined1 (*) [16])(ray + 0x70);
              fVar69 = auVar72._0_4_;
              fVar92 = auVar72._4_4_;
              fVar94 = auVar72._8_4_;
              fVar96 = auVar72._12_4_;
              auVar102._0_4_ = fVar69 * fVar59 + fVar68;
              auVar102._4_4_ = fVar92 * fVar59 + fVar68;
              auVar102._8_4_ = fVar94 * fVar59 + fVar68;
              auVar102._12_4_ = fVar96 * fVar59 + fVar68;
              fVar59 = *(float *)(uVar45 + 0xb0 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x50 + lVar53);
              auVar128._0_4_ = fVar69 * fVar59 + fVar68;
              auVar128._4_4_ = fVar92 * fVar59 + fVar68;
              auVar128._8_4_ = fVar94 * fVar59 + fVar68;
              auVar128._12_4_ = fVar96 * fVar59 + fVar68;
              fVar59 = *(float *)(uVar45 + 0xd0 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x70 + lVar53);
              auVar160._0_4_ = fVar69 * fVar59 + fVar68;
              auVar160._4_4_ = fVar92 * fVar59 + fVar68;
              auVar160._8_4_ = fVar94 * fVar59 + fVar68;
              auVar160._12_4_ = fVar96 * fVar59 + fVar68;
              fVar59 = *(float *)(uVar45 + 0xa0 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x40 + lVar53);
              auVar184._0_4_ = fVar69 * fVar59 + fVar68;
              auVar184._4_4_ = fVar92 * fVar59 + fVar68;
              auVar184._8_4_ = fVar94 * fVar59 + fVar68;
              auVar184._12_4_ = fVar96 * fVar59 + fVar68;
              fVar59 = *(float *)(uVar45 + 0xc0 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x60 + lVar53);
              auVar198._0_4_ = fVar69 * fVar59 + fVar68;
              auVar198._4_4_ = fVar92 * fVar59 + fVar68;
              auVar198._8_4_ = fVar94 * fVar59 + fVar68;
              auVar198._12_4_ = fVar96 * fVar59 + fVar68;
              fVar59 = *(float *)(uVar45 + 0xe0 + lVar53);
              fVar68 = *(float *)(uVar45 + 0x80 + lVar53);
              auVar206._0_4_ = fVar68 + fVar69 * fVar59;
              auVar206._4_4_ = fVar68 + fVar92 * fVar59;
              auVar206._8_4_ = fVar68 + fVar94 * fVar59;
              auVar206._12_4_ = fVar68 + fVar96 * fVar59;
              auVar12._8_8_ = tray.org.field_0._8_8_;
              auVar12._0_8_ = tray.org.field_0._0_8_;
              auVar13._8_8_ = tray.org.field_0._24_8_;
              auVar13._0_8_ = tray.org.field_0._16_8_;
              auVar14._8_8_ = tray.org.field_0._40_8_;
              auVar14._0_8_ = tray.org.field_0._32_8_;
              auVar89 = vsubps_avx(auVar102,auVar12);
              auVar252._0_4_ = tray.rdir.field_0._0_4_ * auVar89._0_4_;
              auVar252._4_4_ = tray.rdir.field_0._4_4_ * auVar89._4_4_;
              auVar252._8_4_ = tray.rdir.field_0._8_4_ * auVar89._8_4_;
              auVar252._12_4_ = tray.rdir.field_0._12_4_ * auVar89._12_4_;
              auVar89 = vsubps_avx(auVar128,auVar13);
              auVar259._0_4_ = auVar89._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar259._4_4_ = auVar89._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar259._8_4_ = auVar89._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar259._12_4_ = auVar89._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar89 = vsubps_avx(auVar160,auVar14);
              auVar263._0_4_ = auVar89._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar263._4_4_ = auVar89._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar263._8_4_ = auVar89._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar263._12_4_ = auVar89._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar89 = vsubps_avx(auVar184,auVar12);
              auVar185._0_4_ = tray.rdir.field_0._0_4_ * auVar89._0_4_;
              auVar185._4_4_ = tray.rdir.field_0._4_4_ * auVar89._4_4_;
              auVar185._8_4_ = tray.rdir.field_0._8_4_ * auVar89._8_4_;
              auVar185._12_4_ = tray.rdir.field_0._12_4_ * auVar89._12_4_;
              auVar89 = vsubps_avx(auVar198,auVar13);
              auVar129._0_4_ = auVar89._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar129._4_4_ = auVar89._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar129._8_4_ = auVar89._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar129._12_4_ = auVar89._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar89 = vsubps_avx(auVar206,auVar14);
              auVar161._0_4_ = auVar89._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar161._4_4_ = auVar89._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar161._8_4_ = auVar89._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar161._12_4_ = auVar89._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar89 = vpminsd_avx(auVar252,auVar185);
              auVar139 = vpminsd_avx(auVar259,auVar129);
              auVar89 = vpmaxsd_avx(auVar89,auVar139);
              auVar139 = vpminsd_avx(auVar263,auVar161);
              auVar89 = vpmaxsd_avx(auVar89,auVar139);
              auVar103._0_4_ = auVar89._0_4_ * 0.99999964;
              auVar103._4_4_ = auVar89._4_4_ * 0.99999964;
              auVar103._8_4_ = auVar89._8_4_ * 0.99999964;
              auVar103._12_4_ = auVar89._12_4_ * 0.99999964;
              auVar89 = vpmaxsd_avx(auVar252,auVar185);
              auVar139 = vpmaxsd_avx(auVar259,auVar129);
              auVar139 = vpminsd_avx(auVar89,auVar139);
              auVar89 = vpmaxsd_avx(auVar263,auVar161);
              auVar139 = vpminsd_avx(auVar139,auVar89);
              auVar89 = vpmaxsd_avx(auVar103,(undefined1  [16])tray.tnear.field_0);
              auVar162._0_4_ = auVar139._0_4_ * 1.0000004;
              auVar162._4_4_ = auVar139._4_4_ * 1.0000004;
              auVar162._8_4_ = auVar139._8_4_ * 1.0000004;
              auVar162._12_4_ = auVar139._12_4_ * 1.0000004;
              auVar139 = vpminsd_avx(auVar162,(undefined1  [16])tray.tfar.field_0);
              if ((uVar42 & 7) == 6) {
                auVar89 = vcmpps_avx(auVar89,auVar139,2);
                uVar43 = *(undefined4 *)(uVar45 + 0xf0 + lVar53);
                auVar163._4_4_ = uVar43;
                auVar163._0_4_ = uVar43;
                auVar163._8_4_ = uVar43;
                auVar163._12_4_ = uVar43;
                auVar139 = vcmpps_avx(auVar163,auVar72,2);
                uVar43 = *(undefined4 *)(uVar45 + 0x100 + lVar53);
                auVar186._4_4_ = uVar43;
                auVar186._0_4_ = uVar43;
                auVar186._8_4_ = uVar43;
                auVar186._12_4_ = uVar43;
                auVar72 = vcmpps_avx(auVar72,auVar186,1);
                auVar72 = vandps_avx(auVar139,auVar72);
                auVar72 = vandps_avx(auVar72,auVar89);
              }
              else {
                auVar72 = vcmpps_avx(auVar89,auVar139,2);
              }
              auVar72 = vandps_avx(auVar72,auVar66);
              auVar72 = vpslld_avx(auVar72,0x1f);
              if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar72[0xf]) {
                auVar91 = ZEXT1664((undefined1  [16])aVar71);
                sVar54 = root.ptr;
              }
              else {
                auVar130._8_4_ = 0x7f800000;
                auVar130._0_8_ = 0x7f8000007f800000;
                auVar130._12_4_ = 0x7f800000;
                auVar72 = vblendvps_avx(auVar130,auVar103,auVar72);
                auVar91 = ZEXT1664(auVar72);
                if (root.ptr != 8) {
                  pNVar57->ptr = root.ptr;
                  pNVar57 = pNVar57 + 1;
                  *paVar58 = aVar71;
                  paVar58 = paVar58 + 1;
                }
              }
              root.ptr = sVar54;
            }
            if (root.ptr == 8) goto LAB_00ec5287;
            auVar66 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar71,6);
            uVar43 = vmovmskps_avx(auVar66);
          } while ((byte)uVar52 < (byte)POPCOUNT(uVar43));
          pNVar57->ptr = root.ptr;
          pNVar57 = pNVar57 + 1;
          *paVar58 = aVar71;
          paVar58 = paVar58 + 1;
LAB_00ec5287:
          iVar44 = 4;
        }
        else {
          while (uVar45 != 0) {
            sVar54 = 0;
            if (uVar45 != 0) {
              for (; (uVar45 >> sVar54 & 1) == 0; sVar54 = sVar54 + 1) {
              }
            }
            uVar45 = uVar45 & uVar45 - 1;
            bVar41 = occluded1(This,bvh,root,sVar54,&pre,ray,&tray,context);
            if (bVar41) {
              terminated.field_0.i[sVar54] = -1;
            }
          }
          auVar66 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar44 = 3;
          if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar66[0xf] < '\0') {
            auVar66._8_4_ = 0xff800000;
            auVar66._0_8_ = 0xff800000ff800000;
            auVar66._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar66,
                               (undefined1  [16])terminated.field_0);
            iVar44 = 2;
          }
          if (uVar52 < uVar42) goto LAB_00ec5010;
        }
      } while (iVar44 != 3);
LAB_00ec6a06:
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar90._8_4_ = 0xff800000;
      auVar90._0_8_ = 0xff800000ff800000;
      auVar90._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar90);
      local_1a60->flags = auVar9._0_4_;
      local_1a60->feature_mask = auVar9._4_4_;
      local_1a60->context = (RTCRayQueryContext *)auVar9._8_8_;
    }
  }
  return;
LAB_00ec52e9:
  do {
    auVar66 = auVar91._0_16_;
    if (pRVar51 == pRVar46) break;
    lVar53 = (long)pRVar51 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    auVar91 = ZEXT1664(local_1998);
    uVar43 = vmovmskps_avx(local_1998);
    pRVar47 = (RTCIntersectArguments *)CONCAT44((int)((ulong)pRVar48 >> 0x20),uVar43);
    lVar56 = 0;
    pRVar48 = pRVar47;
    local_1a58 = pRVar51;
    do {
      auVar72 = auVar91._0_16_;
      if (lVar56 == 4) break;
      uVar42 = *(uint *)(lVar53 + 0x50 + lVar56 * 4);
      pRVar48 = (RTCIntersectArguments *)0x0;
      if (uVar42 == 0xffffffff) break;
      uVar3 = *(uint *)(lVar53 + 0x40 + lVar56 * 4);
      pGVar7 = (context->scene->geometries).items[uVar3].ptr;
      fVar59 = (pGVar7->time_range).lower;
      auVar60._4_4_ = fVar59;
      auVar60._0_4_ = fVar59;
      auVar60._8_4_ = fVar59;
      auVar60._12_4_ = fVar59;
      fVar68 = pGVar7->fnumTimeSegments;
      auVar89 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar60);
      auVar66 = ZEXT416((uint)((pGVar7->time_range).upper - fVar59));
      auVar66 = vshufps_avx(auVar66,auVar66,0);
      auVar66 = vdivps_avx(auVar89,auVar66);
      auVar61._0_4_ = fVar68 * auVar66._0_4_;
      auVar61._4_4_ = fVar68 * auVar66._4_4_;
      auVar61._8_4_ = fVar68 * auVar66._8_4_;
      auVar61._12_4_ = fVar68 * auVar66._12_4_;
      auVar66 = vroundps_avx(auVar61,1);
      auVar89 = vshufps_avx(ZEXT416((uint)(fVar68 + -1.0)),ZEXT416((uint)(fVar68 + -1.0)),0);
      auVar66 = vminps_avx(auVar66,auVar89);
      auVar66 = vmaxps_avx(auVar66,ZEXT816(0) << 0x20);
      auVar89 = vsubps_avx(auVar61,auVar66);
      itime.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar66);
      pRVar48 = (RTCIntersectArguments *)0x0;
      if (pRVar47 != (RTCIntersectArguments *)0x0) {
        for (; ((ulong)pRVar47 >> (long)pRVar48 & 1) == 0;
            pRVar48 = (RTCIntersectArguments *)((long)&pRVar48->flags + 1)) {
        }
      }
      auVar66 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[(long)pRVar48]),0);
      auVar66 = vpcmpeqd_avx(auVar66,(undefined1  [16])itime.field_0);
      auVar66 = local_1998 & ~auVar66;
      fVar68 = auVar89._4_4_;
      fVar69 = auVar89._8_4_;
      fVar92 = auVar89._12_4_;
      fVar59 = auVar89._0_4_;
      pRVar50 = pRVar47;
      pRVar51 = pRVar48;
      local_1a4c = uVar42;
      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf])
      {
        lVar49 = (long)itime.field_0.i[(long)pRVar48] * 0x38;
        pRVar48 = *(RTCIntersectArguments **)(*(long *)&pGVar7[2].numPrimitives + lVar49);
        lVar49 = *(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49);
        uVar45 = (ulong)*(uint *)(lVar53 + lVar56 * 4);
        uVar55 = (ulong)*(uint *)(lVar53 + 0x10 + lVar56 * 4);
        fVar94 = (float)(&pRVar48->flags)[uVar45];
        fVar96 = (float)(&pRVar48->feature_mask)[uVar45];
        fVar98 = *(float *)((long)&pRVar48->context + uVar45 * 4);
        fVar150 = *(float *)(lVar49 + uVar45 * 4);
        fVar158 = *(float *)(lVar49 + 4 + uVar45 * 4);
        fVar152 = *(float *)(lVar49 + 8 + uVar45 * 4);
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar131._12_4_ = 0x3f800000;
        auVar66 = vsubps_avx(auVar131,auVar89);
        fVar179 = auVar66._0_4_;
        fVar154 = auVar66._4_4_;
        fVar70 = auVar66._8_4_;
        fVar93 = auVar66._12_4_;
        auVar245._0_4_ = fVar179 * fVar94 + fVar59 * fVar150;
        auVar245._4_4_ = fVar154 * fVar94 + fVar68 * fVar150;
        auVar245._8_4_ = fVar70 * fVar94 + fVar69 * fVar150;
        auVar245._12_4_ = fVar93 * fVar94 + fVar92 * fVar150;
        auVar253._0_4_ = fVar179 * fVar96 + fVar59 * fVar158;
        auVar253._4_4_ = fVar154 * fVar96 + fVar68 * fVar158;
        auVar253._8_4_ = fVar70 * fVar96 + fVar69 * fVar158;
        auVar253._12_4_ = fVar93 * fVar96 + fVar92 * fVar158;
        auVar164._0_4_ = fVar179 * fVar98 + fVar59 * fVar152;
        auVar164._4_4_ = fVar154 * fVar98 + fVar68 * fVar152;
        auVar164._8_4_ = fVar70 * fVar98 + fVar69 * fVar152;
        auVar164._12_4_ = fVar93 * fVar98 + fVar92 * fVar152;
        fVar94 = (float)(&pRVar48->flags)[uVar55];
        fVar96 = (float)(&pRVar48->feature_mask)[uVar55];
        fVar98 = *(float *)((long)&pRVar48->context + uVar55 * 4);
        fVar150 = *(float *)(lVar49 + uVar55 * 4);
        fVar158 = *(float *)(lVar49 + 4 + uVar55 * 4);
        fVar152 = *(float *)(lVar49 + 8 + uVar55 * 4);
        local_1978 = fVar150 * fVar59 + fVar179 * fVar94;
        fStack_1974 = fVar150 * fVar68 + fVar154 * fVar94;
        fStack_1970 = fVar150 * fVar69 + fVar70 * fVar94;
        fStack_196c = fVar150 * fVar92 + fVar93 * fVar94;
        local_1a98._4_4_ = fVar158 * fVar68 + fVar154 * fVar96;
        local_1a98._0_4_ = fVar158 * fVar59 + fVar179 * fVar96;
        fStack_1a90 = fVar158 * fVar69 + fVar70 * fVar96;
        fStack_1a8c = fVar158 * fVar92 + fVar93 * fVar96;
        local_1b08._4_4_ = fVar152 * fVar68 + fVar154 * fVar98;
        local_1b08._0_4_ = fVar152 * fVar59 + fVar179 * fVar98;
        fStack_1b00 = fVar152 * fVar69 + fVar70 * fVar98;
        fStack_1afc = fVar152 * fVar92 + fVar93 * fVar98;
        uVar45 = (ulong)*(uint *)(lVar53 + 0x20 + lVar56 * 4);
        fVar94 = (float)(&pRVar48->flags)[uVar45];
        fVar96 = (float)(&pRVar48->feature_mask)[uVar45];
        fVar98 = *(float *)((long)&pRVar48->context + uVar45 * 4);
        fVar150 = *(float *)(lVar49 + uVar45 * 4);
        fVar158 = *(float *)(lVar49 + 4 + uVar45 * 4);
        fVar152 = *(float *)(lVar49 + 8 + uVar45 * 4);
        local_1958._4_4_ = fVar150 * fVar68 + fVar154 * fVar94;
        local_1958._0_4_ = fVar150 * fVar59 + fVar179 * fVar94;
        fStack_1950 = fVar150 * fVar69 + fVar70 * fVar94;
        fStack_194c = fVar150 * fVar92 + fVar93 * fVar94;
        local_1938._4_4_ = fVar158 * fVar68 + fVar154 * fVar96;
        local_1938._0_4_ = fVar158 * fVar59 + fVar179 * fVar96;
        fStack_1930 = fVar158 * fVar69 + fVar70 * fVar96;
        fStack_192c = fVar158 * fVar92 + fVar93 * fVar96;
        local_1948._4_4_ = fVar152 * fVar68 + fVar154 * fVar98;
        local_1948._0_4_ = fVar152 * fVar59 + fVar179 * fVar98;
        fStack_1940 = fVar152 * fVar69 + fVar70 * fVar98;
        fStack_193c = fVar152 * fVar92 + fVar93 * fVar98;
        uVar45 = (ulong)*(uint *)(lVar53 + 0x30 + lVar56 * 4);
        fVar94 = *(float *)(lVar49 + uVar45 * 4);
        fVar96 = *(float *)(lVar49 + 4 + uVar45 * 4);
        fVar98 = *(float *)(lVar49 + 8 + uVar45 * 4);
        fVar150 = (float)(&pRVar48->flags)[uVar45];
        auVar222._0_4_ = fVar179 * fVar150 + fVar59 * fVar94;
        auVar222._4_4_ = fVar154 * fVar150 + fVar68 * fVar94;
        auVar222._8_4_ = fVar70 * fVar150 + fVar69 * fVar94;
        auVar222._12_4_ = fVar93 * fVar150 + fVar92 * fVar94;
        fVar94 = (float)(&pRVar48->feature_mask)[uVar45];
        auVar199._0_4_ = fVar179 * fVar94 + fVar59 * fVar96;
        auVar199._4_4_ = fVar154 * fVar94 + fVar68 * fVar96;
        auVar199._8_4_ = fVar70 * fVar94 + fVar69 * fVar96;
        auVar199._12_4_ = fVar93 * fVar94 + fVar92 * fVar96;
        fVar94 = *(float *)((long)&pRVar48->context + uVar45 * 4);
        auVar132._0_4_ = fVar179 * fVar94 + fVar59 * fVar98;
        auVar132._4_4_ = fVar154 * fVar94 + fVar68 * fVar98;
        auVar132._8_4_ = fVar70 * fVar94 + fVar69 * fVar98;
        auVar132._12_4_ = fVar93 * fVar94 + fVar92 * fVar98;
      }
      else {
        while (pRVar50 != (RTCIntersectArguments *)0x0) {
          lVar49 = (long)itime.field_0.i[(long)pRVar51] * 0x38;
          uVar45 = (ulong)*(uint *)(lVar53 + lVar56 * 4);
          auVar66 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar45 * 4);
          auVar139 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar45 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar51 * 4) = auVar66._0_4_;
          uVar43 = vextractps_avx(auVar66,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x10) = uVar43;
          uVar43 = vextractps_avx(auVar66,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x20) = uVar43;
          *(int *)((long)&p1.field_0 + (long)pRVar51 * 4) = auVar139._0_4_;
          uVar43 = vextractps_avx(auVar139,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x10) = uVar43;
          uVar43 = vextractps_avx(auVar139,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x20) = uVar43;
          pRVar50 = (RTCIntersectArguments *)((ulong)pRVar50 ^ 1L << ((ulong)pRVar51 & 0x3f));
          pRVar51 = (RTCIntersectArguments *)0x0;
          if (pRVar50 != (RTCIntersectArguments *)0x0) {
            for (; ((ulong)pRVar50 >> (long)pRVar51 & 1) == 0;
                pRVar51 = (RTCIntersectArguments *)((long)&pRVar51->flags + 1)) {
            }
          }
        }
        auVar88._8_4_ = 0x3f800000;
        auVar88._0_8_ = 0x3f8000003f800000;
        auVar88._12_4_ = 0x3f800000;
        auVar66 = vsubps_avx(auVar88,auVar89);
        uVar27 = p0.field_0._0_4_;
        uVar28 = p0.field_0._4_4_;
        uVar29 = p0.field_0._8_4_;
        uVar30 = p0.field_0._12_4_;
        uVar31 = p0.field_0._32_4_;
        uVar32 = p0.field_0._36_4_;
        uVar35 = p0.field_0._40_4_;
        uVar38 = p0.field_0._44_4_;
        fVar94 = auVar66._0_4_;
        fVar96 = auVar66._4_4_;
        fVar98 = auVar66._8_4_;
        fVar150 = auVar66._12_4_;
        uVar43 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar25 = p1.field_0._8_4_;
        uVar26 = p1.field_0._12_4_;
        auVar253._0_4_ = fVar94 * (float)p0.field_0._16_4_ + fVar59 * (float)p1.field_0._16_4_;
        auVar253._4_4_ = fVar96 * (float)p0.field_0._20_4_ + fVar68 * (float)p1.field_0._20_4_;
        auVar253._8_4_ = fVar98 * (float)p0.field_0._24_4_ + fVar69 * (float)p1.field_0._24_4_;
        auVar253._12_4_ = fVar150 * (float)p0.field_0._28_4_ + fVar92 * (float)p1.field_0._28_4_;
        fVar158 = fVar59 * (float)p1.field_0._32_4_;
        fVar152 = fVar68 * (float)p1.field_0._36_4_;
        fVar179 = fVar69 * (float)p1.field_0._40_4_;
        fVar154 = fVar92 * (float)p1.field_0._44_4_;
        pRVar50 = pRVar47;
        pRVar51 = pRVar48;
        while (pRVar50 != (RTCIntersectArguments *)0x0) {
          lVar49 = (long)itime.field_0.i[(long)pRVar51] * 0x38;
          uVar45 = (ulong)*(uint *)(lVar53 + 0x10 + lVar56 * 4);
          auVar66 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar45 * 4);
          auVar89 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar45 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar51 * 4) = auVar66._0_4_;
          uVar4 = vextractps_avx(auVar66,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar66,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x20) = uVar4;
          *(int *)((long)&p1.field_0 + (long)pRVar51 * 4) = auVar89._0_4_;
          uVar4 = vextractps_avx(auVar89,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x10) = uVar4;
          uVar4 = vextractps_avx(auVar89,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x20) = uVar4;
          pRVar50 = (RTCIntersectArguments *)((ulong)pRVar50 ^ 1L << ((ulong)pRVar51 & 0x3f));
          pRVar51 = (RTCIntersectArguments *)0x0;
          if (pRVar50 != (RTCIntersectArguments *)0x0) {
            for (; ((ulong)pRVar50 >> (long)pRVar51 & 1) == 0;
                pRVar51 = (RTCIntersectArguments *)((long)&pRVar51->flags + 1)) {
            }
          }
        }
        auVar245._0_4_ = fVar94 * (float)uVar27 + fVar59 * (float)uVar43;
        auVar245._4_4_ = fVar96 * (float)uVar28 + fVar68 * (float)uVar24;
        auVar245._8_4_ = fVar98 * (float)uVar29 + fVar69 * (float)uVar25;
        auVar245._12_4_ = fVar150 * (float)uVar30 + fVar92 * (float)uVar26;
        uVar27 = p0.field_0._0_4_;
        uVar28 = p0.field_0._4_4_;
        uVar29 = p0.field_0._8_4_;
        uVar30 = p0.field_0._12_4_;
        uVar4 = p0.field_0._32_4_;
        uVar33 = p0.field_0._36_4_;
        uVar36 = p0.field_0._40_4_;
        uVar39 = p0.field_0._44_4_;
        uVar43 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar25 = p1.field_0._8_4_;
        uVar26 = p1.field_0._12_4_;
        local_1a98._4_4_ = fVar68 * (float)p1.field_0._20_4_ + fVar96 * (float)p0.field_0._20_4_;
        local_1a98._0_4_ = fVar59 * (float)p1.field_0._16_4_ + fVar94 * (float)p0.field_0._16_4_;
        fStack_1a90 = fVar69 * (float)p1.field_0._24_4_ + fVar98 * (float)p0.field_0._24_4_;
        fStack_1a8c = fVar92 * (float)p1.field_0._28_4_ + fVar150 * (float)p0.field_0._28_4_;
        fVar70 = fVar59 * (float)p1.field_0._32_4_;
        fVar93 = fVar68 * (float)p1.field_0._36_4_;
        fVar95 = fVar69 * (float)p1.field_0._40_4_;
        fVar97 = fVar92 * (float)p1.field_0._44_4_;
        pRVar50 = pRVar47;
        pRVar51 = pRVar48;
        while (pRVar50 != (RTCIntersectArguments *)0x0) {
          lVar49 = (long)itime.field_0.i[(long)pRVar51] * 0x38;
          uVar45 = (ulong)*(uint *)(lVar53 + 0x20 + lVar56 * 4);
          auVar66 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar45 * 4);
          auVar89 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar45 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar51 * 4) = auVar66._0_4_;
          uVar5 = vextractps_avx(auVar66,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar66,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar51 * 4 + 0x20) = uVar5;
          *(int *)((long)&p1.field_0 + (long)pRVar51 * 4) = auVar89._0_4_;
          uVar5 = vextractps_avx(auVar89,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x10) = uVar5;
          uVar5 = vextractps_avx(auVar89,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar51 * 4 + 0x20) = uVar5;
          pRVar50 = (RTCIntersectArguments *)((ulong)pRVar50 ^ 1L << ((ulong)pRVar51 & 0x3f));
          pRVar51 = (RTCIntersectArguments *)0x0;
          if (pRVar50 != (RTCIntersectArguments *)0x0) {
            for (; ((ulong)pRVar50 >> (long)pRVar51 & 1) == 0;
                pRVar51 = (RTCIntersectArguments *)((long)&pRVar51->flags + 1)) {
            }
          }
        }
        local_1978 = (float)uVar27 * fVar94 + (float)uVar43 * fVar59;
        fStack_1974 = (float)uVar28 * fVar96 + (float)uVar24 * fVar68;
        fStack_1970 = (float)uVar29 * fVar98 + (float)uVar25 * fVar69;
        fStack_196c = (float)uVar30 * fVar150 + (float)uVar26 * fVar92;
        uVar27 = p0.field_0._0_4_;
        uVar28 = p0.field_0._4_4_;
        uVar29 = p0.field_0._8_4_;
        uVar30 = p0.field_0._12_4_;
        uVar5 = p0.field_0._32_4_;
        uVar34 = p0.field_0._36_4_;
        uVar37 = p0.field_0._40_4_;
        uVar40 = p0.field_0._44_4_;
        uVar43 = p1.field_0._0_4_;
        uVar24 = p1.field_0._4_4_;
        uVar25 = p1.field_0._8_4_;
        uVar26 = p1.field_0._12_4_;
        local_1938._4_4_ = fVar68 * (float)p1.field_0._20_4_ + fVar96 * (float)p0.field_0._20_4_;
        local_1938._0_4_ = fVar59 * (float)p1.field_0._16_4_ + fVar94 * (float)p0.field_0._16_4_;
        fStack_1930 = fVar69 * (float)p1.field_0._24_4_ + fVar98 * (float)p0.field_0._24_4_;
        fStack_192c = fVar92 * (float)p1.field_0._28_4_ + fVar150 * (float)p0.field_0._28_4_;
        fVar234 = fVar59 * (float)p1.field_0._32_4_;
        fVar211 = fVar68 * (float)p1.field_0._36_4_;
        fVar241 = fVar69 * (float)p1.field_0._40_4_;
        fVar242 = fVar92 * (float)p1.field_0._44_4_;
        pRVar51 = pRVar47;
        while (pRVar51 != (RTCIntersectArguments *)0x0) {
          lVar49 = (long)itime.field_0.i[(long)pRVar48] * 0x38;
          uVar45 = (ulong)*(uint *)(lVar53 + 0x30 + lVar56 * 4);
          auVar66 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + lVar49) + uVar45 * 4);
          auVar89 = *(undefined1 (*) [16])
                     (*(long *)(*(long *)&pGVar7[2].numPrimitives + 0x38 + lVar49) + uVar45 * 4);
          *(int *)((long)&p0.field_0 + (long)pRVar48 * 4) = auVar66._0_4_;
          uVar6 = vextractps_avx(auVar66,1);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar48 * 4 + 0x10) = uVar6;
          uVar6 = vextractps_avx(auVar66,2);
          *(undefined4 *)((long)&p0.field_0 + (long)pRVar48 * 4 + 0x20) = uVar6;
          *(int *)((long)&p1.field_0 + (long)pRVar48 * 4) = auVar89._0_4_;
          uVar6 = vextractps_avx(auVar89,1);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar48 * 4 + 0x10) = uVar6;
          uVar6 = vextractps_avx(auVar89,2);
          *(undefined4 *)((long)&p1.field_0 + (long)pRVar48 * 4 + 0x20) = uVar6;
          pRVar51 = (RTCIntersectArguments *)((ulong)pRVar51 ^ 1L << ((ulong)pRVar48 & 0x3f));
          pRVar48 = (RTCIntersectArguments *)0x0;
          if (pRVar51 != (RTCIntersectArguments *)0x0) {
            for (; ((ulong)pRVar51 >> (long)pRVar48 & 1) == 0;
                pRVar48 = (RTCIntersectArguments *)((long)&pRVar48->flags + 1)) {
            }
          }
        }
        auVar164._0_4_ = fVar94 * (float)uVar31 + fVar158;
        auVar164._4_4_ = fVar96 * (float)uVar32 + fVar152;
        auVar164._8_4_ = fVar98 * (float)uVar35 + fVar179;
        auVar164._12_4_ = fVar150 * (float)uVar38 + fVar154;
        local_1b08._4_4_ = fVar96 * (float)uVar33 + fVar93;
        local_1b08._0_4_ = fVar94 * (float)uVar4 + fVar70;
        fStack_1b00 = fVar98 * (float)uVar36 + fVar95;
        fStack_1afc = fVar150 * (float)uVar39 + fVar97;
        local_1948._4_4_ = (float)uVar34 * fVar96 + fVar211;
        local_1948._0_4_ = (float)uVar5 * fVar94 + fVar234;
        fStack_1940 = (float)uVar37 * fVar98 + fVar241;
        fStack_193c = (float)uVar40 * fVar150 + fVar242;
        local_1958._4_4_ = (float)uVar28 * fVar96 + (float)uVar24 * fVar68;
        local_1958._0_4_ = (float)uVar27 * fVar94 + (float)uVar43 * fVar59;
        fStack_1950 = (float)uVar29 * fVar98 + (float)uVar25 * fVar69;
        fStack_194c = (float)uVar30 * fVar150 + (float)uVar26 * fVar92;
        auVar222._0_4_ = fVar59 * (float)p1.field_0._0_4_ + fVar94 * (float)p0.field_0._0_4_;
        auVar222._4_4_ = fVar68 * (float)p1.field_0._4_4_ + fVar96 * (float)p0.field_0._4_4_;
        auVar222._8_4_ = fVar69 * (float)p1.field_0._8_4_ + fVar98 * (float)p0.field_0._8_4_;
        auVar222._12_4_ = fVar92 * (float)p1.field_0._12_4_ + fVar150 * (float)p0.field_0._12_4_;
        auVar199._0_4_ = fVar94 * (float)p0.field_0._16_4_ + fVar59 * (float)p1.field_0._16_4_;
        auVar199._4_4_ = fVar96 * (float)p0.field_0._20_4_ + fVar68 * (float)p1.field_0._20_4_;
        auVar199._8_4_ = fVar98 * (float)p0.field_0._24_4_ + fVar69 * (float)p1.field_0._24_4_;
        auVar199._12_4_ = fVar150 * (float)p0.field_0._28_4_ + fVar92 * (float)p1.field_0._28_4_;
        auVar132._0_4_ = fVar94 * (float)p0.field_0._32_4_ + fVar59 * (float)p1.field_0._32_4_;
        auVar132._4_4_ = fVar96 * (float)p0.field_0._36_4_ + fVar68 * (float)p1.field_0._36_4_;
        auVar132._8_4_ = fVar98 * (float)p0.field_0._40_4_ + fVar69 * (float)p1.field_0._40_4_;
        auVar132._12_4_ = fVar150 * (float)p0.field_0._44_4_ + fVar92 * (float)p1.field_0._44_4_;
      }
      auVar66 = *(undefined1 (*) [16])ray;
      auVar89 = *(undefined1 (*) [16])(ray + 0x10);
      auVar139 = *(undefined1 (*) [16])(ray + 0x20);
      auVar159 = vsubps_avx(auVar245,auVar66);
      local_1a48 = vsubps_avx(auVar253,auVar89);
      auVar183 = vsubps_avx(auVar164,auVar139);
      auVar197 = vsubps_avx(auVar222,auVar66);
      auVar140 = vsubps_avx(auVar199,auVar89);
      auVar212 = vsubps_avx(auVar132,auVar139);
      auVar220 = vsubps_avx(auVar197,auVar159);
      auVar221 = vsubps_avx(auVar140,local_1a48);
      auVar244 = vsubps_avx(auVar212,auVar183);
      fVar59 = local_1a48._0_4_;
      fVar155 = auVar140._0_4_ + fVar59;
      fVar92 = local_1a48._4_4_;
      fVar175 = auVar140._4_4_ + fVar92;
      fVar98 = local_1a48._8_4_;
      fVar177 = auVar140._8_4_ + fVar98;
      fVar152 = local_1a48._12_4_;
      fVar180 = auVar140._12_4_ + fVar152;
      fVar68 = auVar183._0_4_;
      fVar211 = auVar212._0_4_ + fVar68;
      fVar94 = auVar183._4_4_;
      fVar216 = auVar212._4_4_ + fVar94;
      fVar150 = auVar183._8_4_;
      fVar217 = auVar212._8_4_ + fVar150;
      fVar179 = auVar183._12_4_;
      fVar218 = auVar212._12_4_ + fVar179;
      fVar70 = auVar244._0_4_;
      auVar223._0_4_ = fVar155 * fVar70;
      fVar97 = auVar244._4_4_;
      auVar223._4_4_ = fVar175 * fVar97;
      fVar241 = auVar244._8_4_;
      auVar223._8_4_ = fVar177 * fVar241;
      fVar100 = auVar244._12_4_;
      auVar223._12_4_ = fVar180 * fVar100;
      fVar93 = auVar221._0_4_;
      auVar235._0_4_ = fVar211 * fVar93;
      fVar234 = auVar221._4_4_;
      auVar235._4_4_ = fVar216 * fVar234;
      fVar242 = auVar221._8_4_;
      auVar235._8_4_ = fVar217 * fVar242;
      fVar101 = auVar221._12_4_;
      auVar235._12_4_ = fVar218 * fVar101;
      auVar221 = vsubps_avx(auVar235,auVar223);
      fVar69 = auVar159._0_4_;
      fVar219 = auVar197._0_4_ + fVar69;
      fVar96 = auVar159._4_4_;
      fVar227 = auVar197._4_4_ + fVar96;
      fVar158 = auVar159._8_4_;
      fVar228 = auVar197._8_4_ + fVar158;
      fVar154 = auVar159._12_4_;
      fVar231 = auVar197._12_4_ + fVar154;
      fVar95 = auVar220._0_4_;
      auVar213._0_4_ = fVar211 * fVar95;
      fVar211 = auVar220._4_4_;
      auVar213._4_4_ = fVar216 * fVar211;
      fVar216 = auVar220._8_4_;
      auVar213._8_4_ = fVar217 * fVar216;
      fVar217 = auVar220._12_4_;
      auVar213._12_4_ = fVar218 * fVar217;
      auVar236._0_4_ = fVar219 * fVar70;
      auVar236._4_4_ = fVar227 * fVar97;
      auVar236._8_4_ = fVar228 * fVar241;
      auVar236._12_4_ = fVar231 * fVar100;
      auVar220 = vsubps_avx(auVar236,auVar213);
      auVar214._0_4_ = fVar219 * fVar93;
      auVar214._4_4_ = fVar227 * fVar234;
      auVar214._8_4_ = fVar228 * fVar242;
      auVar214._12_4_ = fVar231 * fVar101;
      auVar165._0_4_ = fVar95 * fVar155;
      auVar165._4_4_ = fVar211 * fVar175;
      auVar165._8_4_ = fVar216 * fVar177;
      auVar165._12_4_ = fVar217 * fVar180;
      auVar244 = vsubps_avx(auVar165,auVar214);
      fVar155 = *(float *)(ray + 0x60);
      fVar175 = *(float *)(ray + 100);
      fVar177 = *(float *)(ray + 0x68);
      auVar17 = *(undefined1 (*) [12])(ray + 0x60);
      fVar180 = *(float *)(ray + 0x6c);
      fVar218 = *(float *)(ray + 0x50);
      fVar219 = *(float *)(ray + 0x54);
      fVar227 = *(float *)(ray + 0x58);
      auVar18 = *(undefined1 (*) [12])(ray + 0x50);
      fVar228 = *(float *)(ray + 0x5c);
      fVar231 = *(float *)(ray + 0x40);
      fVar182 = *(float *)(ray + 0x44);
      fVar205 = *(float *)(ray + 0x48);
      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
      fVar210 = *(float *)(ray + 0x4c);
      auVar224._0_4_ =
           fVar231 * auVar221._0_4_ + auVar220._0_4_ * fVar218 + fVar155 * auVar244._0_4_;
      auVar224._4_4_ =
           fVar182 * auVar221._4_4_ + auVar220._4_4_ * fVar219 + fVar175 * auVar244._4_4_;
      auVar224._8_4_ =
           fVar205 * auVar221._8_4_ + auVar220._8_4_ * fVar227 + fVar177 * auVar244._8_4_;
      auVar224._12_4_ =
           fVar210 * auVar221._12_4_ + auVar220._12_4_ * fVar228 + fVar180 * auVar244._12_4_;
      auVar89 = vsubps_avx(_local_1a98,auVar89);
      auVar139 = vsubps_avx(_local_1b08,auVar139);
      auVar220 = vsubps_avx(local_1a48,auVar89);
      auVar183 = vsubps_avx(auVar183,auVar139);
      fVar156 = fVar59 + auVar89._0_4_;
      fVar176 = fVar92 + auVar89._4_4_;
      fVar178 = fVar98 + auVar89._8_4_;
      fVar181 = fVar152 + auVar89._12_4_;
      fVar99 = fVar68 + auVar139._0_4_;
      fVar124 = fVar94 + auVar139._4_4_;
      fVar125 = fVar150 + auVar139._8_4_;
      fVar126 = fVar179 + auVar139._12_4_;
      fVar265 = auVar183._0_4_;
      auVar73._0_4_ = fVar265 * fVar156;
      fVar267 = auVar183._4_4_;
      auVar73._4_4_ = fVar267 * fVar176;
      fVar268 = auVar183._8_4_;
      auVar73._8_4_ = fVar268 * fVar178;
      fVar269 = auVar183._12_4_;
      auVar73._12_4_ = fVar269 * fVar181;
      fVar251 = auVar220._0_4_;
      auVar133._0_4_ = fVar251 * fVar99;
      fVar256 = auVar220._4_4_;
      auVar133._4_4_ = fVar256 * fVar124;
      fVar258 = auVar220._8_4_;
      auVar133._8_4_ = fVar258 * fVar125;
      fVar261 = auVar220._12_4_;
      auVar133._12_4_ = fVar261 * fVar126;
      auVar183 = vsubps_avx(auVar133,auVar73);
      auVar10._4_4_ = fStack_1974;
      auVar10._0_4_ = local_1978;
      auVar10._8_4_ = fStack_1970;
      auVar10._12_4_ = fStack_196c;
      auVar66 = vsubps_avx(auVar10,auVar66);
      auVar159 = vsubps_avx(auVar159,auVar66);
      fVar229 = auVar159._0_4_;
      auVar104._0_4_ = fVar229 * fVar99;
      fVar230 = auVar159._4_4_;
      auVar104._4_4_ = fVar230 * fVar124;
      fVar232 = auVar159._8_4_;
      auVar104._8_4_ = fVar232 * fVar125;
      fVar233 = auVar159._12_4_;
      auVar104._12_4_ = fVar233 * fVar126;
      fVar99 = fVar69 + auVar66._0_4_;
      fVar124 = fVar96 + auVar66._4_4_;
      fVar125 = fVar158 + auVar66._8_4_;
      fVar126 = fVar154 + auVar66._12_4_;
      auVar215._0_4_ = fVar265 * fVar99;
      auVar215._4_4_ = fVar267 * fVar124;
      auVar215._8_4_ = fVar268 * fVar125;
      auVar215._12_4_ = fVar269 * fVar126;
      auVar159 = vsubps_avx(auVar215,auVar104);
      auVar207._0_4_ = fVar251 * fVar99;
      auVar207._4_4_ = fVar256 * fVar124;
      auVar207._8_4_ = fVar258 * fVar125;
      auVar207._12_4_ = fVar261 * fVar126;
      auVar166._0_4_ = fVar229 * fVar156;
      auVar166._4_4_ = fVar230 * fVar176;
      auVar166._8_4_ = fVar232 * fVar178;
      auVar166._12_4_ = fVar233 * fVar181;
      auVar220 = vsubps_avx(auVar166,auVar207);
      auVar208._0_4_ =
           fVar231 * auVar183._0_4_ + fVar155 * auVar220._0_4_ + fVar218 * auVar159._0_4_;
      auVar208._4_4_ =
           fVar182 * auVar183._4_4_ + fVar175 * auVar220._4_4_ + fVar219 * auVar159._4_4_;
      auVar208._8_4_ =
           fVar205 * auVar183._8_4_ + fVar177 * auVar220._8_4_ + fVar227 * auVar159._8_4_;
      auVar208._12_4_ =
           fVar210 * auVar183._12_4_ + fVar180 * auVar220._12_4_ + fVar228 * auVar159._12_4_;
      auVar159 = vsubps_avx(auVar66,auVar197);
      fVar99 = auVar197._0_4_ + auVar66._0_4_;
      fVar124 = auVar197._4_4_ + auVar66._4_4_;
      fVar125 = auVar197._8_4_ + auVar66._8_4_;
      fVar126 = auVar197._12_4_ + auVar66._12_4_;
      auVar66 = vsubps_avx(auVar89,auVar140);
      fVar156 = auVar89._0_4_ + auVar140._0_4_;
      fVar176 = auVar89._4_4_ + auVar140._4_4_;
      fVar178 = auVar89._8_4_ + auVar140._8_4_;
      fVar181 = auVar89._12_4_ + auVar140._12_4_;
      auVar89 = vsubps_avx(auVar139,auVar212);
      fVar127 = auVar139._0_4_ + auVar212._0_4_;
      fVar149 = auVar139._4_4_ + auVar212._4_4_;
      fVar151 = auVar139._8_4_ + auVar212._8_4_;
      fVar153 = auVar139._12_4_ + auVar212._12_4_;
      fVar243 = auVar89._0_4_;
      auVar187._0_4_ = fVar243 * fVar156;
      fVar248 = auVar89._4_4_;
      auVar187._4_4_ = fVar248 * fVar176;
      fVar249 = auVar89._8_4_;
      auVar187._8_4_ = fVar249 * fVar178;
      fVar250 = auVar89._12_4_;
      auVar187._12_4_ = fVar250 * fVar181;
      fVar255 = auVar66._0_4_;
      auVar200._0_4_ = fVar255 * fVar127;
      fVar257 = auVar66._4_4_;
      auVar200._4_4_ = fVar257 * fVar149;
      fVar260 = auVar66._8_4_;
      auVar200._8_4_ = fVar260 * fVar151;
      fVar262 = auVar66._12_4_;
      auVar200._12_4_ = fVar262 * fVar153;
      auVar66 = vsubps_avx(auVar200,auVar187);
      fVar157 = auVar159._0_4_;
      auVar134._0_4_ = fVar157 * fVar127;
      fVar127 = auVar159._4_4_;
      auVar134._4_4_ = fVar127 * fVar149;
      fVar149 = auVar159._8_4_;
      auVar134._8_4_ = fVar149 * fVar151;
      fVar151 = auVar159._12_4_;
      auVar134._12_4_ = fVar151 * fVar153;
      auVar201._0_4_ = fVar243 * fVar99;
      auVar201._4_4_ = fVar248 * fVar124;
      auVar201._8_4_ = fVar249 * fVar125;
      auVar201._12_4_ = fVar250 * fVar126;
      auVar89 = vsubps_avx(auVar201,auVar134);
      auVar74._0_4_ = fVar255 * fVar99;
      auVar74._4_4_ = fVar257 * fVar124;
      auVar74._8_4_ = fVar260 * fVar125;
      auVar74._12_4_ = fVar262 * fVar126;
      auVar105._0_4_ = fVar157 * fVar156;
      auVar105._4_4_ = fVar127 * fVar176;
      auVar105._8_4_ = fVar149 * fVar178;
      auVar105._12_4_ = fVar151 * fVar181;
      auVar139 = vsubps_avx(auVar105,auVar74);
      auVar75._0_4_ = fVar231 * auVar66._0_4_ + fVar155 * auVar139._0_4_ + fVar218 * auVar89._0_4_;
      auVar75._4_4_ = fVar182 * auVar66._4_4_ + fVar175 * auVar139._4_4_ + fVar219 * auVar89._4_4_;
      auVar75._8_4_ = fVar205 * auVar66._8_4_ + fVar177 * auVar139._8_4_ + fVar227 * auVar89._8_4_;
      auVar75._12_4_ =
           fVar210 * auVar66._12_4_ + fVar180 * auVar139._12_4_ + fVar228 * auVar89._12_4_;
      auVar62._0_4_ = auVar75._0_4_ + auVar224._0_4_ + auVar208._0_4_;
      auVar62._4_4_ = auVar75._4_4_ + auVar224._4_4_ + auVar208._4_4_;
      auVar62._8_4_ = auVar75._8_4_ + auVar224._8_4_ + auVar208._8_4_;
      auVar62._12_4_ = auVar75._12_4_ + auVar224._12_4_ + auVar208._12_4_;
      auVar66 = vminps_avx(auVar224,auVar208);
      auVar89 = vminps_avx(auVar66,auVar75);
      auVar202._8_4_ = 0x7fffffff;
      auVar202._0_8_ = 0x7fffffff7fffffff;
      auVar202._12_4_ = 0x7fffffff;
      auVar66 = vandps_avx(auVar62,auVar202);
      auVar135._0_4_ = auVar66._0_4_ * 1.1920929e-07;
      auVar135._4_4_ = auVar66._4_4_ * 1.1920929e-07;
      auVar135._8_4_ = auVar66._8_4_ * 1.1920929e-07;
      auVar135._12_4_ = auVar66._12_4_ * 1.1920929e-07;
      uVar45 = CONCAT44(auVar135._4_4_,auVar135._0_4_);
      auVar188._0_8_ = uVar45 ^ 0x8000000080000000;
      auVar188._8_4_ = -auVar135._8_4_;
      auVar188._12_4_ = -auVar135._12_4_;
      auVar89 = vcmpps_avx(auVar89,auVar188,5);
      auVar139 = vmaxps_avx(auVar224,auVar208);
      auVar139 = vmaxps_avx(auVar139,auVar75);
      auVar139 = vcmpps_avx(auVar139,auVar135,2);
      auVar89 = vorps_avx(auVar89,auVar139);
      auVar139 = auVar72 & auVar89;
      if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar139[0xf] < '\0') {
        auVar76._0_4_ = fVar251 * fVar70;
        auVar76._4_4_ = fVar256 * fVar97;
        auVar76._8_4_ = fVar258 * fVar241;
        auVar76._12_4_ = fVar261 * fVar100;
        auVar106._0_4_ = fVar93 * fVar265;
        auVar106._4_4_ = fVar234 * fVar267;
        auVar106._8_4_ = fVar242 * fVar268;
        auVar106._12_4_ = fVar101 * fVar269;
        auVar183 = vsubps_avx(auVar106,auVar76);
        auVar136._0_4_ = fVar255 * fVar265;
        auVar136._4_4_ = fVar257 * fVar267;
        auVar136._8_4_ = fVar260 * fVar268;
        auVar136._12_4_ = fVar262 * fVar269;
        auVar189._0_4_ = fVar251 * fVar243;
        auVar189._4_4_ = fVar256 * fVar248;
        auVar189._8_4_ = fVar258 * fVar249;
        auVar189._12_4_ = fVar261 * fVar250;
        auVar197 = vsubps_avx(auVar189,auVar136);
        auVar139 = vandps_avx(auVar76,auVar202);
        auVar159 = vandps_avx(auVar136,auVar202);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar183 = vblendvps_avx(auVar197,auVar183,auVar139);
        auVar77._0_4_ = fVar229 * fVar243;
        auVar77._4_4_ = fVar230 * fVar248;
        auVar77._8_4_ = fVar232 * fVar249;
        auVar77._12_4_ = fVar233 * fVar250;
        auVar107._0_4_ = fVar229 * fVar70;
        auVar107._4_4_ = fVar230 * fVar97;
        auVar107._8_4_ = fVar232 * fVar241;
        auVar107._12_4_ = fVar233 * fVar100;
        auVar137._0_4_ = fVar95 * fVar265;
        auVar137._4_4_ = fVar211 * fVar267;
        auVar137._8_4_ = fVar216 * fVar268;
        auVar137._12_4_ = fVar217 * fVar269;
        auVar197 = vsubps_avx(auVar107,auVar137);
        auVar190._0_4_ = fVar265 * fVar157;
        auVar190._4_4_ = fVar267 * fVar127;
        auVar190._8_4_ = fVar268 * fVar149;
        auVar190._12_4_ = fVar269 * fVar151;
        auVar140 = vsubps_avx(auVar190,auVar77);
        auVar139 = vandps_avx(auVar137,auVar202);
        auVar159 = vandps_avx(auVar77,auVar202);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar197 = vblendvps_avx(auVar140,auVar197,auVar139);
        auVar78._0_4_ = fVar251 * fVar157;
        auVar78._4_4_ = fVar256 * fVar127;
        auVar78._8_4_ = fVar258 * fVar149;
        auVar78._12_4_ = fVar261 * fVar151;
        auVar108._0_4_ = fVar95 * fVar251;
        auVar108._4_4_ = fVar211 * fVar256;
        auVar108._8_4_ = fVar216 * fVar258;
        auVar108._12_4_ = fVar217 * fVar261;
        auVar138._0_4_ = fVar229 * fVar93;
        auVar138._4_4_ = fVar230 * fVar234;
        auVar138._8_4_ = fVar232 * fVar242;
        auVar138._12_4_ = fVar233 * fVar101;
        auVar63._0_4_ = fVar229 * fVar255;
        auVar63._4_4_ = fVar230 * fVar257;
        auVar63._8_4_ = fVar232 * fVar260;
        auVar63._12_4_ = fVar233 * fVar262;
        auVar140 = vsubps_avx(auVar108,auVar138);
        auVar212 = vsubps_avx(auVar63,auVar78);
        auVar139 = vandps_avx(auVar138,auVar202);
        auVar159 = vandps_avx(auVar78,auVar202);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar159 = vblendvps_avx(auVar212,auVar140,auVar139);
        local_1ac8 = auVar17._0_4_;
        fStack_1ac4 = auVar17._4_4_;
        fStack_1ac0 = auVar17._8_4_;
        local_1b18 = auVar18._0_4_;
        fStack_1b14 = auVar18._4_4_;
        fStack_1b10 = auVar18._8_4_;
        local_18f8 = auVar19._0_4_;
        fStack_18f4 = auVar19._4_4_;
        fStack_18f0 = auVar19._8_4_;
        fVar70 = auVar183._0_4_ * local_18f8 +
                 auVar159._0_4_ * local_1ac8 + auVar197._0_4_ * local_1b18;
        fVar93 = auVar183._4_4_ * fStack_18f4 +
                 auVar159._4_4_ * fStack_1ac4 + auVar197._4_4_ * fStack_1b14;
        fVar95 = auVar183._8_4_ * fStack_18f0 +
                 auVar159._8_4_ * fStack_1ac0 + auVar197._8_4_ * fStack_1b10;
        fVar97 = auVar183._12_4_ * fVar210 + auVar159._12_4_ * fVar180 + auVar197._12_4_ * fVar228;
        auVar109._0_4_ = fVar70 + fVar70;
        auVar109._4_4_ = fVar93 + fVar93;
        auVar109._8_4_ = fVar95 + fVar95;
        auVar109._12_4_ = fVar97 + fVar97;
        fVar70 = auVar183._0_4_ * fVar69 + auVar159._0_4_ * fVar68 + auVar197._0_4_ * fVar59;
        fVar94 = auVar183._4_4_ * fVar96 + auVar159._4_4_ * fVar94 + auVar197._4_4_ * fVar92;
        fVar96 = auVar183._8_4_ * fVar158 + auVar159._8_4_ * fVar150 + auVar197._8_4_ * fVar98;
        fVar98 = auVar183._12_4_ * fVar154 + auVar159._12_4_ * fVar179 + auVar197._12_4_ * fVar152;
        auVar139 = vrcpps_avx(auVar109);
        fVar59 = auVar139._0_4_;
        auVar167._0_4_ = auVar109._0_4_ * fVar59;
        fVar68 = auVar139._4_4_;
        auVar167._4_4_ = auVar109._4_4_ * fVar68;
        fVar69 = auVar139._8_4_;
        auVar167._8_4_ = auVar109._8_4_ * fVar69;
        fVar92 = auVar139._12_4_;
        auVar167._12_4_ = auVar109._12_4_ * fVar92;
        auVar191._8_4_ = 0x3f800000;
        auVar191._0_8_ = 0x3f8000003f800000;
        auVar191._12_4_ = 0x3f800000;
        auVar139 = vsubps_avx(auVar191,auVar167);
        auVar79._0_4_ = (fVar70 + fVar70) * (fVar59 + fVar59 * auVar139._0_4_);
        auVar79._4_4_ = (fVar94 + fVar94) * (fVar68 + fVar68 * auVar139._4_4_);
        auVar79._8_4_ = (fVar96 + fVar96) * (fVar69 + fVar69 * auVar139._8_4_);
        auVar79._12_4_ = (fVar98 + fVar98) * (fVar92 + fVar92 * auVar139._12_4_);
        auVar139 = vcmpps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar140 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79,2);
        auVar139 = vandps_avx(auVar140,auVar139);
        auVar140 = vcmpps_avx(auVar109,ZEXT816(0),4);
        auVar139 = vandps_avx(auVar140,auVar139);
        auVar89 = vandps_avx(auVar89,auVar72);
        auVar139 = vpslld_avx(auVar139,0x1f);
        auVar140 = vpsrad_avx(auVar139,0x1f);
        auVar139 = auVar89 & auVar140;
        if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar139[0xf] < '\0') {
          auVar89 = vandps_avx(auVar140,auVar89);
          uVar42 = pGVar7->mask;
          auVar141._4_4_ = uVar42;
          auVar141._0_4_ = uVar42;
          auVar141._8_4_ = uVar42;
          auVar141._12_4_ = uVar42;
          auVar139 = vandps_avx(auVar141,*(undefined1 (*) [16])(ray + 0x90));
          auVar139 = vpcmpeqd_avx(auVar139,ZEXT816(0));
          auVar140 = auVar89 & ~auVar139;
          if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar140 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar140 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar140[0xf] < '\0') {
            auVar89 = vandnps_avx(auVar139,auVar89);
            pRVar48 = context->args;
            if ((pRVar48->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar139 = vrcpps_avx(auVar62);
              fVar59 = auVar139._0_4_;
              auVar146._0_4_ = auVar62._0_4_ * fVar59;
              fVar68 = auVar139._4_4_;
              auVar146._4_4_ = auVar62._4_4_ * fVar68;
              fVar69 = auVar139._8_4_;
              auVar146._8_4_ = auVar62._8_4_ * fVar69;
              fVar92 = auVar139._12_4_;
              auVar146._12_4_ = auVar62._12_4_ * fVar92;
              auVar196._8_4_ = 0x3f800000;
              auVar196._0_8_ = 0x3f8000003f800000;
              auVar196._12_4_ = 0x3f800000;
              auVar139 = vsubps_avx(auVar196,auVar146);
              auVar116._0_4_ = fVar59 + fVar59 * auVar139._0_4_;
              auVar116._4_4_ = fVar68 + fVar68 * auVar139._4_4_;
              auVar116._8_4_ = fVar69 + fVar69 * auVar139._8_4_;
              auVar116._12_4_ = fVar92 + fVar92 * auVar139._12_4_;
              auVar147._8_4_ = 0x219392ef;
              auVar147._0_8_ = 0x219392ef219392ef;
              auVar147._12_4_ = 0x219392ef;
              auVar66 = vcmpps_avx(auVar66,auVar147,5);
              auVar66 = vandps_avx(auVar66,auVar116);
              auVar148._0_4_ = auVar66._0_4_ * auVar224._0_4_;
              auVar148._4_4_ = auVar66._4_4_ * auVar224._4_4_;
              auVar148._8_4_ = auVar66._8_4_ * auVar224._8_4_;
              auVar148._12_4_ = auVar66._12_4_ * auVar224._12_4_;
              auVar139 = vminps_avx(auVar148,auVar196);
              auVar117._0_4_ = auVar66._0_4_ * auVar208._0_4_;
              auVar117._4_4_ = auVar66._4_4_ * auVar208._4_4_;
              auVar117._8_4_ = auVar66._8_4_ * auVar208._8_4_;
              auVar117._12_4_ = auVar66._12_4_ * auVar208._12_4_;
              auVar66 = vminps_avx(auVar117,auVar196);
              auVar140 = vsubps_avx(auVar196,auVar139);
              auVar212 = vsubps_avx(auVar196,auVar66);
              auVar16._8_8_ = uVar21;
              auVar16._0_8_ = uVar20;
              vblendvps_avx(auVar139,auVar140,auVar16);
              vblendvps_avx(auVar66,auVar212,auVar16);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0._0_16_ = auVar183;
              p0.field_0._16_16_ = auVar197;
              p0.field_0._32_16_ = auVar159;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              auVar66 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
              vshufps_avx(ZEXT416(local_1a4c),ZEXT416(local_1a4c),0);
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_1890;
              p0.field_0._16_8_ = local_1898;
              p0.field_0._40_8_ = uStack_1880;
              p0.field_0._32_8_ = uStack_1888;
              vcmpps_avx(ZEXT1632(auVar66),ZEXT1632(auVar66),0xf);
              local_1a48 = *(undefined1 (*) [16])(ray + 0x80);
              auVar66 = vblendvps_avx(local_1a48,(undefined1  [16])t.field_0,auVar89);
              *(undefined1 (*) [16])(ray + 0x80) = auVar66;
              p1.field_0._0_8_ = local_1a78;
              p1.field_0._8_8_ = pGVar7->userPtr;
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              local_1a78 = auVar89;
              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar7->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
              }
              if (local_1a78 == (undefined1  [16])0x0) {
                auVar66 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar66 = auVar66 ^ _DAT_01f46b70;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var8)((RTCFilterFunctionNArguments *)&p1);
                }
                auVar89 = vpcmpeqd_avx(local_1a78,_DAT_01f45a50);
                auVar66 = auVar89 ^ _DAT_01f46b70;
                auVar121._8_4_ = 0xff800000;
                auVar121._0_8_ = 0xff800000ff800000;
                auVar121._12_4_ = 0xff800000;
                auVar89 = vblendvps_avx(auVar121,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                        auVar89);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar89;
              }
              auVar66 = vpslld_avx(auVar66,0x1f);
              auVar89 = vpsrad_avx(auVar66,0x1f);
              auVar1._0_4_ = local_1a60->flags;
              auVar1._4_4_ = local_1a60->feature_mask;
              auVar1._8_8_ = local_1a60->context;
              auVar66 = vblendvps_avx(local_1a48,auVar1,auVar66);
              local_1a60->flags = auVar66._0_4_;
              local_1a60->feature_mask = auVar66._4_4_;
              local_1a60->context = (RTCRayQueryContext *)auVar66._8_8_;
              pRVar48 = local_1a60;
            }
            auVar72 = vpandn_avx(auVar89,auVar72);
          }
        }
      }
      if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar72 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar72 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar72[0xf])
      break;
      auVar66 = *(undefined1 (*) [16])ray;
      auVar89 = *(undefined1 (*) [16])(ray + 0x10);
      auVar139 = *(undefined1 (*) [16])(ray + 0x20);
      auVar159 = vsubps_avx(_local_1958,auVar66);
      auVar183 = vsubps_avx(_local_1938,auVar89);
      auVar197 = vsubps_avx(_local_1948,auVar139);
      auVar140 = vsubps_avx(auVar222,auVar66);
      auVar212 = vsubps_avx(auVar199,auVar89);
      auVar220 = vsubps_avx(auVar132,auVar139);
      auVar11._4_4_ = fStack_1974;
      auVar11._0_4_ = local_1978;
      auVar11._8_4_ = fStack_1970;
      auVar11._12_4_ = fStack_196c;
      auVar221 = vsubps_avx(auVar11,auVar66);
      auVar89 = vsubps_avx(_local_1a98,auVar89);
      auVar139 = vsubps_avx(_local_1b08,auVar139);
      local_1a48 = vsubps_avx(auVar221,auVar159);
      auVar66 = vsubps_avx(auVar89,auVar183);
      auVar244 = vsubps_avx(auVar139,auVar197);
      fVar265 = auVar183._0_4_;
      fVar96 = fVar265 + auVar89._0_4_;
      fVar267 = auVar183._4_4_;
      fVar150 = fVar267 + auVar89._4_4_;
      fVar268 = auVar183._8_4_;
      fVar152 = fVar268 + auVar89._8_4_;
      fVar269 = auVar183._12_4_;
      fVar154 = fVar269 + auVar89._12_4_;
      fVar59 = auVar197._0_4_;
      fVar70 = auVar139._0_4_ + fVar59;
      fVar68 = auVar197._4_4_;
      fVar93 = auVar139._4_4_ + fVar68;
      fVar69 = auVar197._8_4_;
      fVar95 = auVar139._8_4_ + fVar69;
      fVar92 = auVar197._12_4_;
      fVar97 = auVar139._12_4_ + fVar92;
      fVar94 = auVar244._0_4_;
      auVar237._0_4_ = fVar96 * fVar94;
      fVar98 = auVar244._4_4_;
      auVar237._4_4_ = fVar150 * fVar98;
      fVar158 = auVar244._8_4_;
      auVar237._8_4_ = fVar152 * fVar158;
      fVar179 = auVar244._12_4_;
      auVar237._12_4_ = fVar154 * fVar179;
      fVar251 = auVar66._0_4_;
      auVar246._0_4_ = fVar251 * fVar70;
      fVar255 = auVar66._4_4_;
      auVar246._4_4_ = fVar255 * fVar93;
      fVar256 = auVar66._8_4_;
      auVar246._8_4_ = fVar256 * fVar95;
      fVar257 = auVar66._12_4_;
      auVar246._12_4_ = fVar257 * fVar97;
      auVar244 = vsubps_avx(auVar246,auVar237);
      fVar149 = auVar159._0_4_;
      fVar234 = fVar149 + auVar221._0_4_;
      fVar153 = auVar159._4_4_;
      fVar211 = fVar153 + auVar221._4_4_;
      fVar229 = auVar159._8_4_;
      fVar241 = fVar229 + auVar221._8_4_;
      fVar232 = auVar159._12_4_;
      fVar242 = fVar232 + auVar221._12_4_;
      fVar100 = local_1a48._0_4_;
      auVar209._0_4_ = fVar100 * fVar70;
      fVar217 = local_1a48._4_4_;
      auVar209._4_4_ = fVar217 * fVar93;
      fVar175 = local_1a48._8_4_;
      auVar209._8_4_ = fVar175 * fVar95;
      fVar180 = local_1a48._12_4_;
      auVar209._12_4_ = fVar180 * fVar97;
      auVar247._0_4_ = fVar234 * fVar94;
      auVar247._4_4_ = fVar211 * fVar98;
      auVar247._8_4_ = fVar241 * fVar158;
      auVar247._12_4_ = fVar242 * fVar179;
      auVar60 = vsubps_avx(auVar247,auVar209);
      auVar238._0_4_ = fVar234 * fVar251;
      auVar238._4_4_ = fVar211 * fVar255;
      auVar238._8_4_ = fVar241 * fVar256;
      auVar238._12_4_ = fVar242 * fVar257;
      auVar142._0_4_ = fVar100 * fVar96;
      auVar142._4_4_ = fVar217 * fVar150;
      auVar142._8_4_ = fVar175 * fVar152;
      auVar142._12_4_ = fVar180 * fVar154;
      auVar61 = vsubps_avx(auVar142,auVar238);
      fVar70 = *(float *)(ray + 0x60);
      fVar93 = *(float *)(ray + 100);
      fVar95 = *(float *)(ray + 0x68);
      auVar18 = *(undefined1 (*) [12])(ray + 0x60);
      fVar97 = *(float *)(ray + 0x6c);
      auVar66 = *(undefined1 (*) [16])(ray + 0x50);
      fVar243 = auVar66._0_4_;
      fVar248 = auVar66._4_4_;
      fVar249 = auVar66._8_4_;
      fVar250 = auVar66._12_4_;
      auVar17 = *(undefined1 (*) [12])(ray + 0x40);
      fVar234 = *(float *)(ray + 0x4c);
      auVar254._0_4_ =
           auVar244._0_4_ * *(float *)(ray + 0x40) +
           auVar61._0_4_ * fVar70 + fVar243 * auVar60._0_4_;
      auVar254._4_4_ =
           auVar244._4_4_ * *(float *)(ray + 0x44) +
           auVar61._4_4_ * fVar93 + fVar248 * auVar60._4_4_;
      auVar254._8_4_ =
           auVar244._8_4_ * *(float *)(ray + 0x48) +
           auVar61._8_4_ * fVar95 + fVar249 * auVar60._8_4_;
      auVar254._12_4_ =
           auVar244._12_4_ * fVar234 + auVar61._12_4_ * fVar97 + fVar250 * auVar60._12_4_;
      auVar66 = vsubps_avx(auVar183,auVar212);
      auVar183 = vsubps_avx(auVar197,auVar220);
      fVar211 = fVar265 + auVar212._0_4_;
      fVar241 = fVar267 + auVar212._4_4_;
      fVar242 = fVar268 + auVar212._8_4_;
      fVar216 = fVar269 + auVar212._12_4_;
      fVar96 = auVar220._0_4_ + fVar59;
      fVar150 = auVar220._4_4_ + fVar68;
      fVar152 = auVar220._8_4_ + fVar69;
      fVar154 = auVar220._12_4_ + fVar92;
      auVar264._8_4_ = 0x7fffffff;
      auVar264._0_8_ = 0x7fffffff7fffffff;
      auVar264._12_4_ = 0x7fffffff;
      fVar258 = auVar183._0_4_;
      auVar266._0_4_ = fVar258 * fVar211;
      fVar260 = auVar183._4_4_;
      auVar266._4_4_ = fVar260 * fVar241;
      fVar261 = auVar183._8_4_;
      auVar266._8_4_ = fVar261 * fVar242;
      fVar262 = auVar183._12_4_;
      auVar266._12_4_ = fVar262 * fVar216;
      fVar205 = auVar66._0_4_;
      auVar168._0_4_ = fVar205 * fVar96;
      fVar210 = auVar66._4_4_;
      auVar168._4_4_ = fVar210 * fVar150;
      fVar99 = auVar66._8_4_;
      auVar168._8_4_ = fVar99 * fVar152;
      fVar124 = auVar66._12_4_;
      auVar168._12_4_ = fVar124 * fVar154;
      auVar66 = vsubps_avx(auVar168,auVar266);
      auVar159 = vsubps_avx(auVar159,auVar140);
      fVar125 = auVar159._0_4_;
      auVar110._0_4_ = fVar125 * fVar96;
      fVar156 = auVar159._4_4_;
      auVar110._4_4_ = fVar156 * fVar150;
      fVar178 = auVar159._8_4_;
      auVar110._8_4_ = fVar178 * fVar152;
      fVar127 = auVar159._12_4_;
      auVar110._12_4_ = fVar127 * fVar154;
      fVar96 = fVar149 + auVar140._0_4_;
      fVar150 = fVar153 + auVar140._4_4_;
      fVar152 = fVar229 + auVar140._8_4_;
      fVar154 = fVar232 + auVar140._12_4_;
      auVar239._0_4_ = fVar96 * fVar258;
      auVar239._4_4_ = fVar150 * fVar260;
      auVar239._8_4_ = fVar152 * fVar261;
      auVar239._12_4_ = fVar154 * fVar262;
      auVar159 = vsubps_avx(auVar239,auVar110);
      auVar225._0_4_ = fVar96 * fVar205;
      auVar225._4_4_ = fVar150 * fVar210;
      auVar225._8_4_ = fVar152 * fVar99;
      auVar225._12_4_ = fVar154 * fVar124;
      auVar143._0_4_ = fVar125 * fVar211;
      auVar143._4_4_ = fVar156 * fVar241;
      auVar143._8_4_ = fVar178 * fVar242;
      auVar143._12_4_ = fVar127 * fVar216;
      auVar183 = vsubps_avx(auVar143,auVar225);
      fVar126 = auVar17._0_4_;
      fVar176 = auVar17._4_4_;
      fVar181 = auVar17._8_4_;
      auVar240._0_4_ = fVar126 * auVar66._0_4_ + auVar183._0_4_ * fVar70 + fVar243 * auVar159._0_4_;
      auVar240._4_4_ = fVar176 * auVar66._4_4_ + auVar183._4_4_ * fVar93 + fVar248 * auVar159._4_4_;
      auVar240._8_4_ = fVar181 * auVar66._8_4_ + auVar183._8_4_ * fVar95 + fVar249 * auVar159._8_4_;
      auVar240._12_4_ =
           fVar234 * auVar66._12_4_ + auVar183._12_4_ * fVar97 + fVar250 * auVar159._12_4_;
      auVar66 = vsubps_avx(auVar140,auVar221);
      fVar211 = auVar140._0_4_ + auVar221._0_4_;
      fVar241 = auVar140._4_4_ + auVar221._4_4_;
      fVar242 = auVar140._8_4_ + auVar221._8_4_;
      fVar216 = auVar140._12_4_ + auVar221._12_4_;
      auVar159 = vsubps_avx(auVar212,auVar89);
      fVar101 = auVar212._0_4_ + auVar89._0_4_;
      fVar155 = auVar212._4_4_ + auVar89._4_4_;
      fVar177 = auVar212._8_4_ + auVar89._8_4_;
      fVar218 = auVar212._12_4_ + auVar89._12_4_;
      auVar89 = vsubps_avx(auVar220,auVar139);
      fVar227 = auVar220._0_4_ + auVar139._0_4_;
      fVar228 = auVar220._4_4_ + auVar139._4_4_;
      fVar231 = auVar220._8_4_ + auVar139._8_4_;
      fVar182 = auVar220._12_4_ + auVar139._12_4_;
      fVar96 = auVar89._0_4_;
      auVar192._0_4_ = fVar101 * fVar96;
      fVar150 = auVar89._4_4_;
      auVar192._4_4_ = fVar155 * fVar150;
      fVar152 = auVar89._8_4_;
      auVar192._8_4_ = fVar177 * fVar152;
      fVar154 = auVar89._12_4_;
      auVar192._12_4_ = fVar218 * fVar154;
      fVar151 = auVar159._0_4_;
      auVar203._0_4_ = fVar151 * fVar227;
      fVar157 = auVar159._4_4_;
      auVar203._4_4_ = fVar157 * fVar228;
      fVar230 = auVar159._8_4_;
      auVar203._8_4_ = fVar230 * fVar231;
      fVar233 = auVar159._12_4_;
      auVar203._12_4_ = fVar233 * fVar182;
      auVar89 = vsubps_avx(auVar203,auVar192);
      fVar219 = auVar66._0_4_;
      auVar169._0_4_ = fVar219 * fVar227;
      fVar227 = auVar66._4_4_;
      auVar169._4_4_ = fVar227 * fVar228;
      fVar228 = auVar66._8_4_;
      auVar169._8_4_ = fVar228 * fVar231;
      fVar231 = auVar66._12_4_;
      auVar169._12_4_ = fVar231 * fVar182;
      auVar204._0_4_ = fVar211 * fVar96;
      auVar204._4_4_ = fVar241 * fVar150;
      auVar204._8_4_ = fVar242 * fVar152;
      auVar204._12_4_ = fVar216 * fVar154;
      auVar66 = vsubps_avx(auVar204,auVar169);
      auVar80._0_4_ = fVar151 * fVar211;
      auVar80._4_4_ = fVar157 * fVar241;
      auVar80._8_4_ = fVar230 * fVar242;
      auVar80._12_4_ = fVar233 * fVar216;
      auVar111._0_4_ = fVar219 * fVar101;
      auVar111._4_4_ = fVar227 * fVar155;
      auVar111._8_4_ = fVar228 * fVar177;
      auVar111._12_4_ = fVar231 * fVar218;
      auVar139 = vsubps_avx(auVar111,auVar80);
      auVar81._0_4_ = fVar126 * auVar89._0_4_ + auVar139._0_4_ * fVar70 + fVar243 * auVar66._0_4_;
      auVar81._4_4_ = fVar176 * auVar89._4_4_ + auVar139._4_4_ * fVar93 + fVar248 * auVar66._4_4_;
      auVar81._8_4_ = fVar181 * auVar89._8_4_ + auVar139._8_4_ * fVar95 + fVar249 * auVar66._8_4_;
      auVar81._12_4_ =
           fVar234 * auVar89._12_4_ + auVar139._12_4_ * fVar97 + fVar250 * auVar66._12_4_;
      auVar226._0_4_ = auVar81._0_4_ + auVar254._0_4_ + auVar240._0_4_;
      auVar226._4_4_ = auVar81._4_4_ + auVar254._4_4_ + auVar240._4_4_;
      auVar226._8_4_ = auVar81._8_4_ + auVar254._8_4_ + auVar240._8_4_;
      auVar226._12_4_ = auVar81._12_4_ + auVar254._12_4_ + auVar240._12_4_;
      auVar66 = vminps_avx(auVar254,auVar240);
      auVar89 = vminps_avx(auVar66,auVar81);
      auVar66 = vandps_avx(auVar226,auVar264);
      auVar170._0_4_ = auVar66._0_4_ * 1.1920929e-07;
      auVar170._4_4_ = auVar66._4_4_ * 1.1920929e-07;
      auVar170._8_4_ = auVar66._8_4_ * 1.1920929e-07;
      auVar170._12_4_ = auVar66._12_4_ * 1.1920929e-07;
      uVar45 = CONCAT44(auVar170._4_4_,auVar170._0_4_);
      auVar193._0_8_ = uVar45 ^ 0x8000000080000000;
      auVar193._8_4_ = -auVar170._8_4_;
      auVar193._12_4_ = -auVar170._12_4_;
      auVar89 = vcmpps_avx(auVar89,auVar193,5);
      auVar139 = vmaxps_avx(auVar254,auVar240);
      auVar139 = vmaxps_avx(auVar139,auVar81);
      auVar139 = vcmpps_avx(auVar139,auVar170,2);
      auVar89 = vorps_avx(auVar89,auVar139);
      auVar139 = auVar72 & auVar89;
      if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar139 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar139 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar139[0xf]
         ) {
        auVar91 = ZEXT1664(auVar72);
      }
      else {
        auVar82._0_4_ = fVar94 * fVar205;
        auVar82._4_4_ = fVar98 * fVar210;
        auVar82._8_4_ = fVar158 * fVar99;
        auVar82._12_4_ = fVar179 * fVar124;
        auVar112._0_4_ = fVar251 * fVar258;
        auVar112._4_4_ = fVar255 * fVar260;
        auVar112._8_4_ = fVar256 * fVar261;
        auVar112._12_4_ = fVar257 * fVar262;
        auVar183 = vsubps_avx(auVar112,auVar82);
        auVar171._0_4_ = fVar258 * fVar151;
        auVar171._4_4_ = fVar260 * fVar157;
        auVar171._8_4_ = fVar261 * fVar230;
        auVar171._12_4_ = fVar262 * fVar233;
        auVar194._0_4_ = fVar205 * fVar96;
        auVar194._4_4_ = fVar210 * fVar150;
        auVar194._8_4_ = fVar99 * fVar152;
        auVar194._12_4_ = fVar124 * fVar154;
        auVar197 = vsubps_avx(auVar194,auVar171);
        auVar139 = vandps_avx(auVar264,auVar82);
        auVar159 = vandps_avx(auVar264,auVar171);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar183 = vblendvps_avx(auVar197,auVar183,auVar139);
        auVar83._0_4_ = fVar125 * fVar96;
        auVar83._4_4_ = fVar156 * fVar150;
        auVar83._8_4_ = fVar178 * fVar152;
        auVar83._12_4_ = fVar127 * fVar154;
        auVar113._0_4_ = fVar125 * fVar94;
        auVar113._4_4_ = fVar156 * fVar98;
        auVar113._8_4_ = fVar178 * fVar158;
        auVar113._12_4_ = fVar127 * fVar179;
        auVar172._0_4_ = fVar100 * fVar258;
        auVar172._4_4_ = fVar217 * fVar260;
        auVar172._8_4_ = fVar175 * fVar261;
        auVar172._12_4_ = fVar180 * fVar262;
        auVar197 = vsubps_avx(auVar113,auVar172);
        auVar195._0_4_ = fVar258 * fVar219;
        auVar195._4_4_ = fVar260 * fVar227;
        auVar195._8_4_ = fVar261 * fVar228;
        auVar195._12_4_ = fVar262 * fVar231;
        auVar140 = vsubps_avx(auVar195,auVar83);
        auVar139 = vandps_avx(auVar264,auVar172);
        auVar159 = vandps_avx(auVar264,auVar83);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar197 = vblendvps_avx(auVar140,auVar197,auVar139);
        auVar84._0_4_ = fVar219 * fVar205;
        auVar84._4_4_ = fVar227 * fVar210;
        auVar84._8_4_ = fVar228 * fVar99;
        auVar84._12_4_ = fVar231 * fVar124;
        auVar114._0_4_ = fVar100 * fVar205;
        auVar114._4_4_ = fVar217 * fVar210;
        auVar114._8_4_ = fVar175 * fVar99;
        auVar114._12_4_ = fVar180 * fVar124;
        auVar144._0_4_ = fVar125 * fVar251;
        auVar144._4_4_ = fVar156 * fVar255;
        auVar144._8_4_ = fVar178 * fVar256;
        auVar144._12_4_ = fVar127 * fVar257;
        auVar64._0_4_ = fVar125 * fVar151;
        auVar64._4_4_ = fVar156 * fVar157;
        auVar64._8_4_ = fVar178 * fVar230;
        auVar64._12_4_ = fVar127 * fVar233;
        auVar140 = vsubps_avx(auVar114,auVar144);
        auVar212 = vsubps_avx(auVar64,auVar84);
        auVar139 = vandps_avx(auVar264,auVar144);
        auVar159 = vandps_avx(auVar264,auVar84);
        auVar139 = vcmpps_avx(auVar139,auVar159,1);
        auVar159 = vblendvps_avx(auVar212,auVar140,auVar139);
        local_1b08._0_4_ = auVar18._0_4_;
        local_1b08._4_4_ = auVar18._4_4_;
        fStack_1b00 = auVar18._8_4_;
        fVar94 = fVar126 * auVar183._0_4_ +
                 auVar159._0_4_ * (float)local_1b08._0_4_ + auVar197._0_4_ * fVar243;
        fVar96 = fVar176 * auVar183._4_4_ +
                 auVar159._4_4_ * (float)local_1b08._4_4_ + auVar197._4_4_ * fVar248;
        fVar98 = fVar181 * auVar183._8_4_ + auVar159._8_4_ * fStack_1b00 + auVar197._8_4_ * fVar249;
        fVar150 = fVar234 * auVar183._12_4_ + auVar159._12_4_ * fVar97 + auVar197._12_4_ * fVar250;
        auVar85._0_4_ = fVar94 + fVar94;
        auVar85._4_4_ = fVar96 + fVar96;
        auVar85._8_4_ = fVar98 + fVar98;
        auVar85._12_4_ = fVar150 + fVar150;
        fVar94 = auVar183._0_4_ * fVar149 + auVar159._0_4_ * fVar59 + auVar197._0_4_ * fVar265;
        fVar96 = auVar183._4_4_ * fVar153 + auVar159._4_4_ * fVar68 + auVar197._4_4_ * fVar267;
        fVar98 = auVar183._8_4_ * fVar229 + auVar159._8_4_ * fVar69 + auVar197._8_4_ * fVar268;
        fVar150 = auVar183._12_4_ * fVar232 + auVar159._12_4_ * fVar92 + auVar197._12_4_ * fVar269;
        auVar139 = vrcpps_avx(auVar85);
        fVar59 = auVar139._0_4_;
        auVar145._0_4_ = auVar85._0_4_ * fVar59;
        fVar68 = auVar139._4_4_;
        auVar145._4_4_ = auVar85._4_4_ * fVar68;
        fVar69 = auVar139._8_4_;
        auVar145._8_4_ = auVar85._8_4_ * fVar69;
        fVar92 = auVar139._12_4_;
        auVar145._12_4_ = auVar85._12_4_ * fVar92;
        auVar173._8_4_ = 0x3f800000;
        auVar173._0_8_ = 0x3f8000003f800000;
        auVar173._12_4_ = 0x3f800000;
        auVar139 = vsubps_avx(auVar173,auVar145);
        auVar65._0_4_ = (fVar94 + fVar94) * (fVar59 + fVar59 * auVar139._0_4_);
        auVar65._4_4_ = (fVar96 + fVar96) * (fVar68 + fVar68 * auVar139._4_4_);
        auVar65._8_4_ = (fVar98 + fVar98) * (fVar69 + fVar69 * auVar139._8_4_);
        auVar65._12_4_ = (fVar150 + fVar150) * (fVar92 + fVar92 * auVar139._12_4_);
        auVar139 = vcmpps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar140 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar65,2);
        auVar139 = vandps_avx(auVar140,auVar139);
        auVar140 = vcmpps_avx(auVar85,ZEXT816(0) << 0x20,4);
        auVar139 = vandps_avx(auVar140,auVar139);
        auVar91 = ZEXT1664(auVar72);
        auVar89 = vandps_avx(auVar72,auVar89);
        auVar139 = vpslld_avx(auVar139,0x1f);
        auVar140 = vpsrad_avx(auVar139,0x1f);
        auVar139 = auVar89 & auVar140;
        if ((((auVar139 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar139 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar139 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar139[0xf] < '\0') {
          auVar89 = vandps_avx(auVar140,auVar89);
          uVar42 = *(uint *)(lVar53 + 0x40 + lVar56 * 4);
          pRVar48 = (RTCIntersectArguments *)(context->scene->geometries).items;
          lVar49 = *(long *)(&pRVar48->flags + (ulong)uVar42 * 2);
          uVar43 = *(undefined4 *)(lVar49 + 0x34);
          auVar115._4_4_ = uVar43;
          auVar115._0_4_ = uVar43;
          auVar115._8_4_ = uVar43;
          auVar115._12_4_ = uVar43;
          auVar139 = vandps_avx(auVar115,*(undefined1 (*) [16])(ray + 0x90));
          auVar139 = vpcmpeqd_avx(auVar139,ZEXT816(0) << 0x20);
          auVar140 = auVar89 & ~auVar139;
          if ((((auVar140 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar140 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar140 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar140[0xf] < '\0') {
            uVar3 = *(uint *)(lVar53 + 0x50 + lVar56 * 4);
            auVar89 = vandnps_avx(auVar139,auVar89);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar48 = context->args, *(long *)(lVar49 + 0x48) != 0)) {
              auVar139 = vrcpps_avx(auVar226);
              fVar59 = auVar139._0_4_;
              auVar118._0_4_ = auVar226._0_4_ * fVar59;
              fVar68 = auVar139._4_4_;
              auVar118._4_4_ = auVar226._4_4_ * fVar68;
              fVar69 = auVar139._8_4_;
              auVar118._8_4_ = auVar226._8_4_ * fVar69;
              fVar92 = auVar139._12_4_;
              auVar118._12_4_ = auVar226._12_4_ * fVar92;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar139 = vsubps_avx(auVar174,auVar118);
              auVar86._0_4_ = fVar59 + fVar59 * auVar139._0_4_;
              auVar86._4_4_ = fVar68 + fVar68 * auVar139._4_4_;
              auVar86._8_4_ = fVar69 + fVar69 * auVar139._8_4_;
              auVar86._12_4_ = fVar92 + fVar92 * auVar139._12_4_;
              auVar119._8_4_ = 0x219392ef;
              auVar119._0_8_ = 0x219392ef219392ef;
              auVar119._12_4_ = 0x219392ef;
              auVar66 = vcmpps_avx(auVar66,auVar119,5);
              auVar66 = vandps_avx(auVar66,auVar86);
              auVar120._0_4_ = auVar66._0_4_ * auVar254._0_4_;
              auVar120._4_4_ = auVar66._4_4_ * auVar254._4_4_;
              auVar120._8_4_ = auVar66._8_4_ * auVar254._8_4_;
              auVar120._12_4_ = auVar66._12_4_ * auVar254._12_4_;
              auVar139 = vminps_avx(auVar120,auVar174);
              auVar87._0_4_ = auVar66._0_4_ * auVar240._0_4_;
              auVar87._4_4_ = auVar66._4_4_ * auVar240._4_4_;
              auVar87._8_4_ = auVar66._8_4_ * auVar240._8_4_;
              auVar87._12_4_ = auVar66._12_4_ * auVar240._12_4_;
              auVar66 = vminps_avx(auVar87,auVar174);
              auVar140 = vsubps_avx(auVar174,auVar139);
              auVar212 = vsubps_avx(auVar174,auVar66);
              auVar15._8_8_ = uVar23;
              auVar15._0_8_ = uVar22;
              vblendvps_avx(auVar139,auVar140,auVar15);
              vblendvps_avx(auVar66,auVar212,auVar15);
              p1.field_0._0_8_ = &itime;
              p1.field_0._8_8_ = &t;
              p1.field_0._16_8_ = &v_1;
              p1.field_0._24_8_ = &u;
              p0.field_0._0_16_ = auVar183;
              p0.field_0._16_16_ = auVar197;
              p0.field_0._32_16_ = auVar159;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
              ::
              _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                          *)&p1,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                 *)&p0);
              auVar66 = vpshufd_avx(ZEXT416(uVar42),0);
              auVar139 = ZEXT416(uVar3);
              vshufps_avx(auVar139,auVar139,0);
              p0.field_0.field_0.x.field_0 = (vfloat_impl<4>)(vfloat_impl<4>)itime.field_0;
              p0.field_0._24_8_ = uStack_1890;
              p0.field_0._16_8_ = local_1898;
              p0.field_0._40_8_ = uStack_1880;
              p0.field_0._32_8_ = uStack_1888;
              vcmpps_avx(ZEXT1632(auVar66),ZEXT1632(auVar66),0xf);
              auVar66 = *(undefined1 (*) [16])(ray + 0x80);
              auVar139 = vblendvps_avx(auVar66,(undefined1  [16])t.field_0,auVar89);
              *(undefined1 (*) [16])(ray + 0x80) = auVar139;
              p1.field_0._0_8_ = local_1a78;
              p1.field_0._8_8_ = *(undefined8 *)(lVar49 + 0x18);
              p1.field_0._16_8_ = context->user;
              p1.field_0._32_8_ = &p0;
              p1.field_0._40_4_ = 4;
              p1.field_0._24_8_ = ray;
              local_1a78 = auVar89;
              if (*(code **)(lVar49 + 0x48) != (code *)0x0) {
                (**(code **)(lVar49 + 0x48))(&p1);
              }
              if (local_1a78 == (undefined1  [16])0x0) {
                auVar89 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar89 = auVar89 ^ _DAT_01f46b70;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar49 + 0x3e) & 0x40) != 0)))) {
                  (*p_Var8)((RTCFilterFunctionNArguments *)&p1);
                }
                auVar139 = vpcmpeqd_avx(local_1a78,_DAT_01f45a50);
                auVar89 = auVar139 ^ _DAT_01f46b70;
                auVar122._8_4_ = 0xff800000;
                auVar122._0_8_ = 0xff800000ff800000;
                auVar122._12_4_ = 0xff800000;
                auVar139 = vblendvps_avx(auVar122,*(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                         auVar139);
                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar139;
              }
              auVar139 = vpslld_avx(auVar89,0x1f);
              auVar89 = vpsrad_avx(auVar139,0x1f);
              auVar2._0_4_ = local_1a60->flags;
              auVar2._4_4_ = local_1a60->feature_mask;
              auVar2._8_8_ = local_1a60->context;
              auVar66 = vblendvps_avx(auVar66,auVar2,auVar139);
              local_1a60->flags = auVar66._0_4_;
              local_1a60->feature_mask = auVar66._4_4_;
              local_1a60->context = (RTCRayQueryContext *)auVar66._8_8_;
              pRVar48 = local_1a60;
            }
            auVar66 = vpandn_avx(auVar89,auVar72);
            auVar91 = ZEXT1664(auVar66);
          }
        }
      }
      lVar56 = lVar56 + 1;
      auVar72 = auVar91._0_16_;
    } while ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar91[0xf] < '\0');
    auVar91 = ZEXT1664(local_1998);
    auVar89 = vandps_avx(auVar72,local_1998);
    pRVar51 = (RTCIntersectArguments *)((long)&local_1a58->flags + 1);
    auVar72 = local_1998 & auVar72;
    auVar66 = local_1998;
    local_1998 = auVar89;
  } while ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar72[0xf] < '\0');
  auVar66 = vpcmpeqd_avx(auVar66,auVar66);
  auVar67._0_4_ = local_1998._0_4_ ^ auVar66._0_4_;
  auVar67._4_4_ = local_1998._4_4_ ^ auVar66._4_4_;
  auVar67._8_4_ = local_1998._8_4_ ^ auVar66._8_4_;
  auVar67._12_4_ = local_1998._12_4_ ^ auVar66._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar67,(undefined1  [16])terminated.field_0);
  auVar66 = auVar66 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf])
  goto LAB_00ec6a06;
  auVar123._8_4_ = 0xff800000;
  auVar123._0_8_ = 0xff800000ff800000;
  auVar123._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar123,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00ec4fcd;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }